

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

iterator_range<protozero::const_svarint_iterator<int>,_std::pair<protozero::const_svarint_iterator<int>,_protozero::const_svarint_iterator<int>_>_>
* __thiscall
protozero::pbf_reader::get_packed<protozero::const_svarint_iterator<int>>
          (iterator_range<protozero::const_svarint_iterator<int>,_std::pair<protozero::const_svarint_iterator<int>,_protozero::const_svarint_iterator<int>_>_>
           *__return_storage_ptr__,pbf_reader *this)

{
  pbf_tag_type pVar1;
  assert_error *this_00;
  const_svarint_iterator<int> local_40;
  const_svarint_iterator<int> local_30;
  pbf_length_type local_20;
  pbf_length_type len;
  pbf_reader *local_10;
  pbf_reader *this_local;
  
  local_10 = this;
  pVar1 = tag(this);
  if (pVar1 == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before accessing field value\"")
    ;
    __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
  }
  local_20 = get_len_and_skip(this);
  const_svarint_iterator<int>::const_svarint_iterator
            (&local_30,this->m_data + -(ulong)local_20,this->m_data);
  const_svarint_iterator<int>::const_svarint_iterator(&local_40,this->m_data,this->m_data);
  iterator_range<protozero::const_svarint_iterator<int>,_std::pair<protozero::const_svarint_iterator<int>,_protozero::const_svarint_iterator<int>_>_>
  ::iterator_range(__return_storage_ptr__,&local_30,&local_40);
  return __return_storage_ptr__;
}

Assistant:

iterator_range<T> get_packed() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        const auto len = get_len_and_skip();
        return {T{m_data - len, m_data},
                T{m_data, m_data}};
    }